

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_SINCDECP_r_32(DisasContext_conflict1 *s,arg_incdec_pred *a)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_i64 reg;
  TCGTemp *pTVar2;
  
  s_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    reg = cpu_reg_aarch64(s,a->rd);
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    do_cntp((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,(TCGv_i64)s->uc->tcg_ctx,
            (int)(TCGv_i64)((long)pTVar2 - (long)s_00),a->esz,a->pg);
    do_sat_addsub_32(s_00,reg,(TCGv_i64)((long)pTVar2 - (long)s_00),a->u != 0,a->d != 0);
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_SINCDECP_r_32(DisasContext *s, arg_incdec_pred *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 reg = cpu_reg(s, a->rd);
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);

        do_cntp(s, val, a->esz, a->pg, a->pg);
        do_sat_addsub_32(tcg_ctx, reg, val, a->u, a->d);
    }
    return true;
}